

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O3

void tap_test_done(pcut_item_t *test,int outcome,char *error_message,char *teardown_error_message,
                  char *extra_output)

{
  char *pcVar1;
  char *pcVar2;
  
  if (outcome == 0) {
    pcVar2 = "";
    pcVar1 = "ok";
  }
  else {
    failed_tests_in_suite = failed_tests_in_suite + 1;
    failed_test_counter = failed_test_counter + 1;
    pcVar2 = " aborted";
    if (outcome == 1) {
      pcVar2 = " failed";
    }
    pcVar1 = "not ok";
  }
  printf("%s %d %s%s\n",pcVar1,(ulong)(uint)test_counter,test->name,pcVar2);
  print_by_lines(error_message,"# error: ");
  print_by_lines(teardown_error_message,"# error: ");
  print_by_lines(extra_output,"# stdio: ");
  return;
}

Assistant:

static void tap_test_done(pcut_item_t *test, int outcome,
		const char *error_message, const char *teardown_error_message,
		const char *extra_output) {
	const char *test_name = test->name;
	const char *status_str = NULL;
	const char *fail_error_str = NULL;

	if (outcome != PCUT_OUTCOME_PASS) {
		failed_tests_in_suite++;
		failed_test_counter++;
	}

	switch (outcome) {
	case PCUT_OUTCOME_PASS:
		status_str = "ok";
		fail_error_str = "";
		break;
	case PCUT_OUTCOME_FAIL:
		status_str = "not ok";
		fail_error_str = " failed";
		break;
	default:
		status_str = "not ok";
		fail_error_str = " aborted";
		break;
	}
	printf("%s %d %s%s\n", status_str, test_counter, test_name, fail_error_str);

	print_by_lines(error_message, "# error: ");
	print_by_lines(teardown_error_message, "# error: ");

	print_by_lines(extra_output, "# stdio: ");
}